

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O1

int Rwr_ManNodeVolume(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1)

{
  uint uVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  int Volume;
  int local_1c;
  
  local_1c = 0;
  uVar1 = p->nTravIds;
  p->nTravIds = uVar1 + 1;
  if (0x8ffffffe < uVar1) {
    lVar3 = (long)p->vForest->nSize;
    if (0 < lVar3) {
      ppvVar2 = p->vForest->pArray;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar4] + 4) = 0;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    p->nTravIds = 1;
  }
  Rwr_Trav_rec(p,p0,&local_1c);
  Rwr_Trav_rec(p,p1,&local_1c);
  return local_1c;
}

Assistant:

int Rwr_ManNodeVolume( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1 )
{
    int Volume = 0;
    Rwr_ManIncTravId( p );
    Rwr_Trav_rec( p, p0, &Volume );
    Rwr_Trav_rec( p, p1, &Volume );
    return Volume;
}